

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  Ch *pCVar3;
  byte *pbVar4;
  bool bVar5;
  byte bVar6;
  Ch *pCVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char cVar11;
  undefined4 uVar12;
  ulong i;
  uint uVar13;
  ulong uVar14;
  SizeType SVar15;
  uint i_00;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  int iVar19;
  bool bVar20;
  int iVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  cVar11 = *is->src_;
  if (cVar11 == '\"') {
    ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar11 == '[') {
    is->src_ = is->src_ + 1;
    bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartArray(handler);
    if (bVar22) {
      SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is)
      ;
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        SVar15 = 0;
      }
      else {
        SVar15 = 0;
        while( true ) {
          ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar9 = is->src_;
          if (*pcVar9 != ',') break;
          is->src_ = pcVar9 + 1;
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SVar15 = SVar15 + 1;
          if (*is->src_ == ']') {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::EndArray(handler,SVar15);
            pCVar7 = is->src_;
            if (bVar22) {
              is->src_ = pCVar7 + 1;
              return;
            }
            pCVar3 = is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            *(long *)(this + 0x38) = (long)pCVar7 - (long)pCVar3;
            return;
          }
        }
        if (*pcVar9 != ']') {
          lVar8 = (long)pcVar9 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_0014bf4b;
        }
        is->src_ = pcVar9 + 1;
        SVar15 = SVar15 + 1;
      }
      bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::EndArray(handler,SVar15);
      if (bVar22) {
        return;
      }
    }
    lVar8 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0014bf4b:
    *(long *)(this + 0x38) = lVar8;
    return;
  }
  if (cVar11 == 'f') {
    pCVar3 = is->src_;
    pCVar7 = pCVar3 + 1;
    is->src_ = pCVar7;
    uVar12 = 3;
    if (pCVar3[1] == 'a') {
      pCVar7 = pCVar3 + 2;
      is->src_ = pCVar7;
      if (pCVar3[2] == 'l') {
        pCVar7 = pCVar3 + 3;
        is->src_ = pCVar7;
        if (pCVar3[3] == 's') {
          pCVar7 = pCVar3 + 4;
          is->src_ = pCVar7;
          if (pCVar3[4] == 'e') {
            is->src_ = pCVar3 + 5;
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Bool(handler,false);
            if (bVar22) {
              return;
            }
            pCVar7 = is->src_;
            uVar12 = 0x10;
          }
        }
      }
    }
    pCVar3 = is->head_;
    *(undefined4 *)(this + 0x30) = uVar12;
    *(long *)(this + 0x38) = (long)pCVar7 - (long)pCVar3;
    return;
  }
  if (cVar11 == '{') {
    is->src_ = is->src_ + 1;
    bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartObject(handler);
    if (bVar22) {
      SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is)
      ;
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      pcVar9 = is->src_;
      cVar11 = *pcVar9;
      if (cVar11 == '}') {
        is->src_ = pcVar9 + 1;
        SVar15 = 0;
      }
      else {
        SVar15 = 0;
        while( true ) {
          if (cVar11 != '\"') {
            lVar8 = (long)pcVar9 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_0014bdac;
          }
          ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar9 = is->src_;
          if (*pcVar9 != ':') {
            lVar8 = (long)pcVar9 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0014bdac;
          }
          is->src_ = pcVar9 + 1;
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar9 = is->src_;
          if (*pcVar9 != ',') break;
          is->src_ = pcVar9 + 1;
          SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                    (this,is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar9 = is->src_;
          cVar11 = *pcVar9;
          SVar15 = SVar15 + 1;
          if (cVar11 == '}') {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::EndObject(handler,SVar15);
            pCVar7 = is->src_;
            if (bVar22) {
              is->src_ = pCVar7 + 1;
              return;
            }
            pCVar3 = is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            *(long *)(this + 0x38) = (long)pCVar7 - (long)pCVar3;
            return;
          }
        }
        if (*pcVar9 != '}') {
          lVar8 = (long)pcVar9 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0014bdac;
        }
        is->src_ = pcVar9 + 1;
        SVar15 = SVar15 + 1;
      }
      bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::EndObject(handler,SVar15);
      if (bVar22) {
        return;
      }
    }
    lVar8 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0014bdac:
    *(long *)(this + 0x38) = lVar8;
    return;
  }
  if (cVar11 == 't') {
    pCVar3 = is->src_;
    pCVar7 = pCVar3 + 1;
    is->src_ = pCVar7;
    uVar12 = 3;
    if (pCVar3[1] == 'r') {
      pCVar7 = pCVar3 + 2;
      is->src_ = pCVar7;
      if (pCVar3[2] == 'u') {
        pCVar7 = pCVar3 + 3;
        is->src_ = pCVar7;
        if (pCVar3[3] == 'e') {
          is->src_ = pCVar3 + 4;
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Bool(handler,true);
          if (bVar22) {
            return;
          }
          pCVar7 = is->src_;
          uVar12 = 0x10;
        }
      }
    }
    pCVar3 = is->head_;
    *(undefined4 *)(this + 0x30) = uVar12;
    *(long *)(this + 0x38) = (long)pCVar7 - (long)pCVar3;
    return;
  }
  if (cVar11 == 'n') {
    ParseNull<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar4 = (byte *)is->src_;
  bVar2 = *pbVar4;
  pbVar17 = pbVar4;
  bVar6 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar17 = pbVar4 + 1;
    bVar6 = pbVar4[1];
  }
  pCVar7 = is->head_;
  if (bVar6 == 0x30) {
    uVar13 = (uint)pbVar17[1];
    pbVar17 = pbVar17 + 1;
    dVar23 = 0.0;
    bVar22 = false;
    i = 0;
    bVar20 = false;
    uVar10 = 0;
    bVar5 = false;
    i_00 = 0;
LAB_0014c1fc:
    if ((char)uVar13 == '.') {
      pbVar18 = pbVar17 + 1;
      uVar13 = (uint)*pbVar18;
      pbVar17 = pbVar17 + 1;
      if ((byte)(*pbVar18 - 0x3a) < 0xf6) {
        uVar12 = 0xe;
        pbVar18 = pbVar17;
      }
      else {
        iVar19 = 0;
        if (!bVar22) {
          if (!bVar5) {
            i = (ulong)i_00;
          }
          iVar19 = 0;
          while ((('/' < (char)(byte)uVar13 && ((byte)uVar13 < 0x3a)) && (i >> 0x35 == 0))) {
            pbVar18 = pbVar17 + 1;
            pbVar17 = pbVar17 + 1;
            iVar19 = iVar19 + -1;
            i = (ulong)(uVar13 - 0x30) + i * 10;
            uVar10 = (ulong)((int)uVar10 + (uint)(i != 0));
            uVar13 = (uint)*pbVar18;
          }
          auVar25._8_4_ = (int)(i >> 0x20);
          auVar25._0_8_ = i;
          auVar25._12_4_ = 0x45300000;
          dVar23 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
          bVar20 = true;
        }
        while (pbVar18 = pbVar17, '/' < (char)(byte)uVar13) {
          if (0x39 < (byte)uVar13) goto LAB_0014c330;
          if ((int)uVar10 < 0x11) {
            dVar23 = (double)(int)(uVar13 - 0x30) + dVar23 * 10.0;
            iVar19 = iVar19 + -1;
            if (0.0 < dVar23) {
              uVar10 = (ulong)((int)uVar10 + 1);
            }
          }
          pbVar18 = pbVar17 + 1;
          pbVar17 = pbVar17 + 1;
          uVar13 = (uint)*pbVar18;
        }
LAB_0014c2da:
        iVar21 = 0;
LAB_0014c430:
        if (bVar20) {
          dVar23 = internal::StrtodNormalPrecision(dVar23,iVar21 + iVar19);
          if (1.79769313486232e+308 < dVar23) goto LAB_0014c452;
          if (bVar2 == 0x2d) {
            dVar23 = -dVar23;
          }
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Double(handler,dVar23);
        }
        else if (bVar5) {
          if (bVar2 == 0x2d) {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Int64(handler,-i);
          }
          else {
            bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Uint64(handler,i);
          }
        }
        else if (bVar2 == 0x2d) {
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int(handler,-i_00);
        }
        else {
          bVar22 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint(handler,i_00);
        }
        if (bVar22 != false) goto LAB_0014c4ce;
        uVar12 = 0x10;
        pbVar17 = pbVar4;
      }
    }
    else {
      iVar19 = 0;
LAB_0014c330:
      pbVar18 = pbVar17;
      if ((uVar13 | 0x20) != 0x65) goto LAB_0014c2da;
      uVar10 = (ulong)i_00;
      if (bVar5) {
        uVar10 = i;
      }
      if (!bVar20) {
        auVar26._8_4_ = (int)(uVar10 >> 0x20);
        auVar26._0_8_ = uVar10;
        auVar26._12_4_ = 0x45300000;
        dVar23 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
        bVar20 = true;
      }
      bVar6 = pbVar17[1];
      bVar22 = bVar6 != 0x2b;
      if ((bVar22) && (bVar6 != 0x2d)) {
        pbVar17 = pbVar17 + 1;
        bVar22 = false;
      }
      else {
        bVar6 = pbVar17[2];
        pbVar17 = pbVar17 + 2;
      }
      if (9 < (byte)(bVar6 - 0x30)) {
        uVar12 = 0xf;
        pbVar18 = pbVar17;
        goto LAB_0014c455;
      }
      pbVar18 = pbVar17 + 1;
      iVar16 = bVar6 - 0x30;
      if (bVar22) {
        pbVar17 = pbVar18;
        while (pbVar18 = pbVar17, (byte)(*pbVar18 - 0x30) < 10) {
          iVar16 = iVar16 * 10 + (uint)*pbVar18 + -0x30;
          pbVar17 = pbVar18 + 1;
          if ((iVar19 + 0x7ffffff7) / 10 < iVar16) {
            do {
              pbVar1 = pbVar18 + 1;
              pbVar18 = pbVar18 + 1;
              pbVar17 = pbVar18;
            } while ((byte)(*pbVar1 - 0x30) < 10);
          }
        }
LAB_0014c423:
        iVar21 = -iVar16;
        if (!bVar22) {
          iVar21 = iVar16;
        }
        goto LAB_0014c430;
      }
      do {
        bVar6 = *pbVar18;
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_0014c423;
        pbVar18 = pbVar18 + 1;
        iVar16 = iVar16 * 10 + (uint)bVar6 + -0x30;
      } while (iVar16 <= 0x134 - iVar19);
LAB_0014c452:
      uVar12 = 0xd;
      pbVar17 = pbVar4;
    }
  }
  else {
    if ((byte)(bVar6 - 0x31) < 9) {
      i_00 = bVar6 - 0x30;
      uVar10 = 0;
      if (bVar2 == 0x2d) {
LAB_0014c064:
        bVar6 = pbVar17[uVar10 + 1];
        uVar14 = (ulong)bVar6;
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_0014c132;
        if (i_00 < 0xccccccc) {
LAB_0014c07c:
          i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
          uVar10 = uVar10 + 1;
          goto LAB_0014c064;
        }
        uVar13 = i_00;
        if (i_00 != 0xccccccc) goto LAB_0014c0dc;
        if (bVar6 < 0x39) goto LAB_0014c07c;
        uVar14 = 0x39;
        uVar13 = 0xccccccc;
LAB_0014c0dc:
        i_00 = uVar13;
        pbVar17 = pbVar17 + uVar10 + 1;
        i = (ulong)i_00;
        if (bVar2 == 0x2d) {
          while( true ) {
            uVar13 = (uint)uVar14;
            if (9 < (byte)((byte)uVar14 - 0x30)) break;
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar14 || i != 0xccccccccccccccc))
            goto LAB_0014c194;
            i = (uVar14 & 0xf) + i * 10;
            uVar10 = (ulong)((int)uVar10 + 1);
            uVar14 = (ulong)pbVar17[1];
            pbVar17 = pbVar17 + 1;
          }
        }
        else {
          while( true ) {
            uVar13 = (uint)uVar14;
            if (9 < (byte)((byte)uVar14 - 0x30)) break;
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar14 || i != 0x1999999999999999))
            goto LAB_0014c194;
            i = (uVar14 & 0xf) + i * 10;
            uVar10 = (ulong)((int)uVar10 + 1);
            uVar14 = (ulong)pbVar17[1];
            pbVar17 = pbVar17 + 1;
          }
        }
        dVar23 = 0.0;
        bVar5 = true;
        bVar22 = false;
        bVar20 = false;
      }
      else {
        while( true ) {
          bVar6 = pbVar17[uVar10 + 1];
          uVar14 = (ulong)bVar6;
          if (9 < (byte)(bVar6 - 0x30)) break;
          if ((0x19999998 < i_00) &&
             ((uVar13 = i_00, i_00 != 0x19999999 || (uVar13 = 0x19999999, 0x35 < bVar6))))
          goto LAB_0014c0dc;
          i_00 = (i_00 * 10 + (uint)bVar6) - 0x30;
          uVar10 = uVar10 + 1;
        }
LAB_0014c132:
        uVar13 = (uint)bVar6;
        pbVar17 = pbVar17 + uVar10 + 1;
        dVar23 = 0.0;
        bVar22 = false;
        i = 0;
        bVar20 = false;
        bVar5 = false;
      }
      goto LAB_0014c1fc;
    }
    uVar12 = 3;
    pbVar18 = pbVar17;
  }
LAB_0014c455:
  *(undefined4 *)(this + 0x30) = uVar12;
  *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar7;
LAB_0014c4ce:
  is->src_ = (Ch *)pbVar18;
  is->head_ = pCVar7;
  return;
LAB_0014c194:
  auVar24._8_4_ = (int)(i >> 0x20);
  auVar24._0_8_ = i;
  auVar24._12_4_ = 0x45300000;
  dVar23 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while (uVar13 = (uint)uVar14, (byte)((char)uVar14 - 0x30U) < 10) {
    dVar23 = dVar23 * 10.0 + (double)(int)(uVar13 - 0x30);
    pbVar18 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
    uVar14 = (ulong)*pbVar18;
  }
  bVar22 = true;
  bVar20 = true;
  bVar5 = true;
  goto LAB_0014c1fc;
}

Assistant:

Ch Peek() const { return *src_; }